

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogDerivativesStates
          (BeagleCPUImpl<float,_1,_0> *this,int *tipStates,float *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          float *categoryWeights,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  ulong uVar10;
  long lVar11;
  float *pfVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  float *local_70;
  
  iVar2 = this->kCategoryCount;
  if (0 < (long)iVar2) {
    lVar11 = 0;
    uVar3 = this->kPatternCount;
    lVar16 = (long)this->kPartialsPaddedStateCount;
    uVar4 = this->kStateCount;
    pfVar7 = this->grandNumeratorDerivTmp;
    pfVar8 = this->grandDenominatorDerivTmp;
    pfVar9 = this->gTransitionMatrices[firstDerivativeIndex];
    local_70 = preOrderPartial;
    do {
      if (0 < (int)uVar3) {
        uVar15 = 0;
        iVar5 = this->kTransPaddedStateCount;
        iVar6 = this->kMatrixSize;
        pfVar12 = local_70;
        do {
          if ((int)uVar4 < 1) {
            auVar17 = ZEXT816(0);
          }
          else {
            iVar13 = tipStates[uVar15] + iVar6 * (int)lVar11;
            auVar17 = ZEXT816(0);
            uVar10 = 0;
            do {
              lVar14 = (long)iVar13;
              iVar13 = iVar13 + iVar5;
              auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)pfVar9[lVar14]),
                                        ZEXT416((uint)pfVar12[uVar10]));
              uVar10 = uVar10 + 1;
            } while (uVar4 != uVar10);
          }
          pfVar12 = pfVar12 + lVar16;
          fVar1 = preOrderPartial
                  [(lVar11 * (int)uVar3 + uVar15) * lVar16 + (long)(tipStates[uVar15] % (int)uVar4)]
          ;
          auVar17 = vfmadd213ss_fma(ZEXT416((uint)categoryWeights[lVar11]),auVar17,
                                    ZEXT416((uint)pfVar7[uVar15]));
          pfVar7[uVar15] = auVar17._0_4_;
          auVar17 = vfmadd213ss_fma(ZEXT416((uint)categoryWeights[lVar11]),ZEXT416((uint)fVar1),
                                    ZEXT416((uint)pfVar8[uVar15]));
          pfVar8[uVar15] = auVar17._0_4_;
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar3);
      }
      lVar11 = lVar11 + 1;
      local_70 = local_70 + (int)uVar3 * lVar16;
    } while (lVar11 != iVar2);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesStates(const int *tipStates,
                                                                     const REALTYPE *preOrderPartial,
                                                                     const int firstDerivativeIndex,
                                                                     const int secondDerivativeIndex,
                                                                     const double *categoryRates,
                                                                     const REALTYPE *categoryWeights,
                                                                     double *outDerivatives,
                                                                     double *outSumDerivatives,
                                                                     double *outSumSquaredDerivatives) {

    const REALTYPE *firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];

    for (int category = 0; category < kCategoryCount; category++) {

        for (int pattern = 0; pattern < kPatternCount; pattern++) {

            const int patternIndex = category * kPatternCount + pattern;
            const int state = tipStates[pattern];

            REALTYPE numerator = 0.0;
            REALTYPE denominator = preOrderPartial[patternIndex * kPartialsPaddedStateCount + (state % kStateCount)];
            // TODO (state % kStateCount) is not correct; should imply missing character
            // TODO See calcCrossProductsStates() for possible solution

            for (int k = 0; k < kStateCount; k++) {
                numerator += firstDerivMatrix[category * kMatrixSize + k * kTransPaddedStateCount + state] *
                             preOrderPartial[patternIndex * kPartialsPaddedStateCount + k];
            }

            grandNumeratorDerivTmp[pattern] += categoryWeights[category] * numerator;
            grandDenominatorDerivTmp[pattern] += categoryWeights[category] * denominator;
        }
    }
}